

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int lemon_sprintf(char *str,char *format,...)

{
  byte bVar1;
  byte bVar2;
  ushort *puVar3;
  char in_AL;
  uint uVar4;
  int extraout_EAX;
  ushort **ppuVar5;
  uint *puVar6;
  uint nIn;
  undefined8 in_RCX;
  byte *pbVar7;
  int iVar8;
  undefined8 in_RDX;
  int iVar9;
  long lVar10;
  ulong uVar11;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar12;
  long lVar13;
  uint uVar14;
  uint *puVar15;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int nUsed;
  uint *local_170;
  ulong local_168;
  char *local_160;
  va_list ap;
  byte abStack_f7 [15];
  uint local_e8 [4];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  puVar15 = (uint *)&stack0x00000008;
  nUsed = 0;
  ap[0].gp_offset = 0x10;
  ap[0].fp_offset = 0x30;
  *str = '\0';
  local_168 = 0x10;
  iVar8 = 0;
  local_160 = str;
  ap[0].overflow_arg_area = puVar15;
  ap[0].reg_save_area = local_e8;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    lVar10 = (long)iVar8;
    lVar13 = 0;
    while( true ) {
      iVar12 = (int)lVar13;
      if (format[lVar13 + lVar10] == '\0') {
        lemon_addtext(local_160,&nUsed,format + lVar10,iVar12,0);
        return extraout_EAX;
      }
      if (format[lVar13 + lVar10] == '%') break;
      lVar13 = lVar13 + 1;
    }
    local_170 = puVar15;
    lemon_addtext(local_160,&nUsed,format + lVar10,iVar12,0);
    iVar9 = iVar8 + 1 + iVar12;
    bVar1 = format[iVar9];
    ppuVar5 = __ctype_b_loc();
    puVar3 = *ppuVar5;
    if ((*(byte *)((long)puVar3 + (ulong)bVar1 * 2 + 1) & 8) == 0) {
      if (bVar1 == 0x2d) {
        if ((*(byte *)((long)puVar3 + (ulong)(byte)format[lVar13 + lVar10 + 2] * 2 + 1) & 8) != 0)
        goto LAB_00109796;
        goto LAB_00109a1c;
      }
      bVar2 = bVar1;
      iVar12 = 0;
    }
    else {
LAB_00109796:
      if (bVar1 == 0x2d) {
        iVar9 = iVar8 + 2 + iVar12;
      }
      pbVar7 = (byte *)(format + iVar9);
      iVar8 = 0;
      while (bVar2 = *pbVar7, (*(byte *)((long)puVar3 + (ulong)bVar2 * 2 + 1) & 8) != 0) {
        iVar8 = iVar8 * 10 + (int)(char)bVar2 + -0x30;
        iVar9 = iVar9 + 1;
        pbVar7 = pbVar7 + 1;
      }
      iVar12 = -iVar8;
      if (bVar1 != 0x2d) {
        iVar12 = iVar8;
      }
    }
    if (bVar2 == 0x25) {
      lemon_addtext(local_160,&nUsed,"%",1,0);
      puVar15 = local_170;
    }
    else {
      uVar11 = local_168 & 0xffffffff;
      if (bVar2 == 0x2e) {
        iVar8 = bcmp(format + iVar9,".*s",3);
        if (iVar8 != 0) goto LAB_00109a1c;
        uVar14 = (uint)local_168;
        if (uVar14 < 0x29) {
          uVar4 = uVar14 + 8;
          local_168 = (ulong)uVar4;
          ap[0].gp_offset = uVar4;
          nIn = *(uint *)((long)local_e8 + uVar11);
          puVar6 = local_170;
          if (0x20 < uVar14) goto LAB_001099c0;
          puVar6 = (uint *)((long)local_e8 + (ulong)uVar4);
          local_168 = (ulong)(uVar14 + 0x10);
          ap[0].gp_offset = uVar14 + 0x10;
          puVar15 = local_170;
        }
        else {
          nIn = *local_170;
          puVar6 = local_170 + 2;
LAB_001099c0:
          puVar15 = puVar6 + 2;
          ap[0].overflow_arg_area = puVar15;
        }
        iVar9 = iVar9 + 2;
        pbVar7 = *(byte **)puVar6;
      }
      else {
        uVar14 = (uint)local_168;
        puVar15 = local_170;
        if (bVar2 == 0x73) {
          if (uVar14 < 0x29) {
            local_168 = (ulong)(uVar14 + 8);
            ap[0].gp_offset = uVar14 + 8;
            puVar6 = (uint *)((long)local_e8 + uVar11);
          }
          else {
            puVar15 = local_170 + 2;
            puVar6 = local_170;
            ap[0].overflow_arg_area = puVar15;
          }
          pbVar7 = *(byte **)puVar6;
          nIn = 0xffffffff;
        }
        else {
          if (bVar2 != 100) {
LAB_00109a1c:
            fwrite("illegal format\n",0xf,1,_stderr);
            exit(1);
          }
          if (uVar14 < 0x29) {
            local_168 = (ulong)(uVar14 + 8);
            ap[0].gp_offset = uVar14 + 8;
            puVar6 = (uint *)((long)local_e8 + uVar11);
          }
          else {
            puVar15 = local_170 + 2;
            puVar6 = local_170;
            ap[0].overflow_arg_area = puVar15;
          }
          uVar14 = *puVar6;
          if ((int)uVar14 < 0) {
            lemon_addtext(local_160,&nUsed,"-",1,iVar12);
            uVar14 = -uVar14;
          }
          else if (uVar14 == 0) {
            lemon_addtext(local_160,&nUsed,"0",1,iVar12);
            uVar14 = 0;
          }
          lVar10 = 0;
          for (; 0 < (int)uVar14; uVar14 = uVar14 / 10) {
            abStack_f7[lVar10] = (byte)((ulong)uVar14 % 10) | 0x30;
            lVar10 = lVar10 + -1;
          }
          nIn = (uint)-lVar10;
          pbVar7 = abStack_f7 + (1 - (-lVar10 & 0xffffffffU));
        }
      }
      lemon_addtext(local_160,&nUsed,(char *)pbVar7,nIn,iVar12);
    }
    iVar8 = iVar9 + 1;
  } while( true );
}

Assistant:

static int lemon_sprintf(char *str, const char *format, ...){
  va_list ap;
  int rc;
  va_start(ap, format);
  rc = lemon_vsprintf(str, format, ap);
  va_end(ap);
  return rc;
}